

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::GetLanguages
          (cmGeneratorTarget *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *languages,string *config)

{
  _Rb_tree_header *p_Var1;
  pointer ppcVar2;
  pointer ppcVar3;
  bool bVar4;
  string *__v;
  _Rb_tree_node_base *p_Var5;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range1;
  undefined1 auVar6 [8];
  pointer ppcVar7;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  cmGeneratorTarget *gt;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> objectTargets;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  objectLibraries;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_b8;
  cmGeneratorTarget *local_a0;
  undefined1 local_98 [8];
  pointer ppcStack_90;
  _Base_ptr local_88;
  _Rb_tree_node_base *local_80;
  _Rb_tree_node_base *p_Stack_78;
  size_t local_70;
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  local_60;
  
  bVar4 = cmTarget::CanCompileSources(this->Target);
  if (bVar4) {
    local_b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetSourceFiles(this,&local_b8,config);
    ppcVar2 = local_b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar7 = local_b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar7 != ppcVar2;
        ppcVar7 = ppcVar7 + 1) {
      __v = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(*ppcVar7);
      if (__v->_M_string_length != 0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)languages,__v);
      }
    }
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == false) {
      local_98 = (undefined1  [8])0x0;
      ppcStack_90 = (pointer)0x0;
      local_88 = (_Base_ptr)0x0;
      GetObjectLibrariesCMP0026
                (this,(vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)local_98)
      ;
      ppcVar3 = ppcStack_90;
      if (local_98 != (undefined1  [8])ppcStack_90) {
        auVar6 = local_98;
        do {
          local_a0 = *(cmGeneratorTarget **)auVar6;
          std::
          _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
          ::_M_insert_unique<cmGeneratorTarget_const*const&>
                    ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                      *)&local_60,&local_a0);
          auVar6 = (undefined1  [8])((long)auVar6 + 8);
        } while (auVar6 != (undefined1  [8])ppcVar3);
      }
      if (local_98 != (undefined1  [8])0x0) {
        operator_delete((void *)local_98,(long)local_88 - (long)local_98);
      }
    }
    else {
      GetSourceObjectLibraries
                ((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  *)local_98,this,config);
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
      ::clear(&local_60);
      if (local_88 != (_Base_ptr)0x0) {
        local_60._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)ppcStack_90;
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent = local_88;
        local_60._M_impl.super__Rb_tree_header._M_header._M_left = local_80;
        local_60._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_78;
        local_88->_M_parent = &p_Var1->_M_header;
        local_60._M_impl.super__Rb_tree_header._M_node_count = local_70;
        local_88 = (_Base_ptr)0x0;
        local_70 = 0;
        local_80 = (_Rb_tree_node_base *)&ppcStack_90;
        p_Stack_78 = (_Rb_tree_node_base *)&ppcStack_90;
      }
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
      ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                   *)local_98);
    }
    for (p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &local_60._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      GetLanguages(*(cmGeneratorTarget **)(p_Var5 + 1),languages,config);
    }
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
    ::~_Rb_tree(&local_60);
    if (local_b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetLanguages(std::set<std::string>& languages,
                                     const std::string& config) const
{
  // Targets that do not compile anything have no languages.
  if (!this->CanCompileSources()) {
    return;
  }

  std::vector<cmSourceFile*> sourceFiles;
  this->GetSourceFiles(sourceFiles, config);
  for (cmSourceFile* src : sourceFiles) {
    const std::string& lang = src->GetOrDetermineLanguage();
    if (!lang.empty()) {
      languages.insert(lang);
    }
  }

  std::set<cmGeneratorTarget const*> objectLibraries;
  if (!this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    std::vector<cmGeneratorTarget*> objectTargets;
    this->GetObjectLibrariesCMP0026(objectTargets);
    for (cmGeneratorTarget* gt : objectTargets) {
      objectLibraries.insert(gt);
    }
  } else {
    objectLibraries = this->GetSourceObjectLibraries(config);
  }
  for (cmGeneratorTarget const* objLib : objectLibraries) {
    objLib->GetLanguages(languages, config);
  }
}